

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLDriver.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLDriver::draw2DLine
          (COpenGLDriver *this,vector2d<int> *start,vector2d<int> *end,SColor color)

{
  uchar *puVar1;
  SColor in_ECX;
  undefined4 uVar2;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  COpenGLDriver *unaff_retaddr;
  GLint colorSize;
  bool in_stack_000000cd;
  bool in_stack_000000ce;
  bool in_stack_000000cf;
  COpenGLDriver *in_stack_000000d0;
  u32 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  vector3d<float> local_38;
  vector3d<float> local_2c;
  int *local_20;
  int *local_18;
  long lVar4;
  undefined4 in_stack_fffffffffffffff8;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  lVar4 = in_RDI;
  disableTextures((COpenGLDriver *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                  (u32)((ulong)in_RDI >> 0x20));
  SColor::getAlpha((SColor *)&stack0xfffffffffffffffc);
  setRenderStates2DMode(in_stack_000000d0,in_stack_000000cf,in_stack_000000ce,in_stack_000000cd);
  *(u32 *)(in_RDI + 0x1078) = in_ECX.color;
  *(u32 *)(in_RDI + 0x109c) = in_ECX.color;
  core::vector3d<float>::vector3d(&local_2c,(float)*local_18,(float)local_18[1],0.0);
  *(undefined8 *)(in_RDI + 0x1060) = local_2c._0_8_;
  *(float *)(in_RDI + 0x1068) = local_2c.Z;
  core::vector3d<float>::vector3d(&local_38,(float)*local_20,(float)local_20[1],0.0);
  *(undefined8 *)(in_RDI + 0x1084) = local_38._0_8_;
  *(float *)(in_RDI + 0x108c) = local_38.Z;
  if (((*(byte *)(in_RDI + 0x583) & 1) == 0) && ((*(byte *)(in_RDI + 0x5f9) & 1) == 0)) {
    getColorBuffer(unaff_retaddr,(void *)CONCAT44(in_ECX.color,in_stack_fffffffffffffff8),
                   (u32)((ulong)lVar4 >> 0x20),(E_VERTEX_TYPE)lVar4);
  }
  COpenGLCacheHandler::setClientState
            ((COpenGLCacheHandler *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             SUB41(in_stack_ffffffffffffffac >> 0x18,0),SUB41(in_stack_ffffffffffffffac >> 0x10,0),
             SUB41(in_stack_ffffffffffffffac >> 8,0),SUB41(in_stack_ffffffffffffffac,0));
  glVertexPointer(2,0x1406,0x24,in_RDI + 0x1060);
  uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffb4);
  if ((*(byte *)(in_RDI + 0x583) & 1) == 0) {
    uVar3 = CONCAT13(*(undefined1 *)(in_RDI + 0x5f9),(int3)in_stack_ffffffffffffffb4);
  }
  uVar2 = 4;
  if ((uVar3 & 0x1000000) != 0) {
    uVar2 = 0x80e1;
  }
  if (((*(byte *)(in_RDI + 0x583) & 1) == 0) && ((*(byte *)(in_RDI + 0x5f9) & 1) == 0)) {
    puVar1 = core::array<unsigned_char>::operator[]
                       ((array<unsigned_char> *)CONCAT44(uVar3,uVar2),in_stack_ffffffffffffffac);
    glColorPointer(uVar2,0x1401,0,puVar1);
  }
  else {
    glColorPointer(uVar2,0x1401,0x24,in_RDI + 0x1078);
  }
  glDrawElements(1,2,0x1403,&Quad2DIndices);
  glDrawArrays(0,0,1);
  glDrawArrays(0,1);
  return;
}

Assistant:

void COpenGLDriver::draw2DLine(const core::position2d<s32> &start,
		const core::position2d<s32> &end, SColor color)
{
	{
		disableTextures();
		setRenderStates2DMode(color.getAlpha() < 255, false, false);

		Quad2DVertices[0].Color = color;
		Quad2DVertices[1].Color = color;

		Quad2DVertices[0].Pos = core::vector3df((f32)start.X, (f32)start.Y, 0.0f);
		Quad2DVertices[1].Pos = core::vector3df((f32)end.X, (f32)end.Y, 0.0f);

		if (!FeatureAvailable[IRR_ARB_vertex_array_bgra] && !FeatureAvailable[IRR_EXT_vertex_array_bgra])
			getColorBuffer(Quad2DVertices, 2, EVT_STANDARD);

		CacheHandler->setClientState(true, false, true, false);

		glVertexPointer(2, GL_FLOAT, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(Quad2DVertices))[0].Pos);

#ifdef GL_BGRA
		const GLint colorSize = (FeatureAvailable[IRR_ARB_vertex_array_bgra] || FeatureAvailable[IRR_EXT_vertex_array_bgra]) ? GL_BGRA : 4;
#else
		const GLint colorSize = 4;
#endif
		if (FeatureAvailable[IRR_ARB_vertex_array_bgra] || FeatureAvailable[IRR_EXT_vertex_array_bgra])
			glColorPointer(colorSize, GL_UNSIGNED_BYTE, sizeof(S3DVertex), &(static_cast<const S3DVertex *>(Quad2DVertices))[0].Color);
		else {
			_IRR_DEBUG_BREAK_IF(ColorBuffer.size() == 0);
			glColorPointer(colorSize, GL_UNSIGNED_BYTE, 0, &ColorBuffer[0]);
		}

		glDrawElements(GL_LINES, 2, GL_UNSIGNED_SHORT, Quad2DIndices);

		// Draw sometimes non-drawn first & last pixel (search for "diamond exit rule")
		// HACK this messes with alpha blending
		glDrawArrays(GL_POINTS, 0, 1);
		glDrawArrays(GL_POINTS, 1, 1);
	}
}